

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_assert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *o;
  SQInteger SVar2;
  HSQUIRRELVM v_00;
  SQRESULT SVar3;
  HSQUIRRELVM in_RDI;
  SQChar *str;
  SQInteger msgIdx;
  SQObjectPtr *arg;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  SQChar *in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  o = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  bVar1 = SQVM::IsFalse(o);
  if (bVar1) {
    SVar2 = sq_gettop(in_RDI);
    if (2 < SVar2) {
      v_00 = (HSQUIRRELVM)stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe0 = (HSQUIRRELVM)0x0;
      if ((*(SQObjectType *)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted ==
           OT_CLOSURE) ||
         (*(SQObjectType *)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted ==
          OT_NATIVECLOSURE)) {
        sq_pushroottable((HSQUIRRELVM)0x12d2ce);
        SVar3 = sq_call(in_stack_00000028,in_stack_00000020,(SQBool)v,(SQBool)arg);
        if (-1 < SVar3) {
          in_stack_ffffffffffffffe0 = (HSQUIRRELVM)0xffffffffffffffff;
        }
      }
      else {
        in_stack_ffffffffffffffe0 = (HSQUIRRELVM)0x3;
      }
      if ((in_stack_ffffffffffffffe0 != (HSQUIRRELVM)0x0) &&
         (SVar3 = sq_tostring(v,(SQInteger)arg), -1 < SVar3)) {
        in_stack_ffffffffffffffd8 = (SQChar *)0x0;
        SVar3 = sq_getstring(v_00,(SQInteger)in_stack_ffffffffffffffe0,(SQChar **)0x0);
        if (-1 < SVar3) {
          SVar3 = sq_throwerror(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
          return SVar3;
        }
      }
    }
    local_8 = sq_throwerror(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        if (sq_gettop(v) > 2) {
            SQObjectPtr &arg = stack_get(v,3);
            SQInteger msgIdx = 0;
            if (sq_type(arg)==OT_CLOSURE || sq_type(arg)==OT_NATIVECLOSURE) {
                sq_pushroottable(v);
                if (SQ_SUCCEEDED(sq_call(v, 1, SQTrue, SQFalse)))
                    msgIdx = -1;
            }
            else
                msgIdx = 3;

            if (msgIdx!=0 && SQ_SUCCEEDED(sq_tostring(v,msgIdx))) {
                const SQChar *str = 0;
                if (SQ_SUCCEEDED(sq_getstring(v,-1,&str)))
                    return sq_throwerror(v, str);
            }
        }

        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}